

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall HighsMipSolverData::checkObjIntegrality(HighsMipSolverData *this)

{
  long lVar1;
  bool bVar2;
  long *in_RDI;
  HighsObjectiveFunction *unaff_retaddr;
  
  HighsObjectiveFunction::checkIntegrality(unaff_retaddr,(double)in_RDI);
  bVar2 = HighsObjectiveFunction::isIntegral((HighsObjectiveFunction *)(in_RDI + 0xbe3));
  if ((bVar2) && (*(int *)((long)in_RDI + 0x641c) == 0)) {
    lVar1 = *(long *)(*in_RDI + 8);
    HighsObjectiveFunction::integralScale((HighsObjectiveFunction *)(in_RDI + 0xbe3));
    highsLogUser((HighsLogOptions *)(lVar1 + 0x380),kInfo,
                 "Objective function is integral with scale %g\n");
  }
  return;
}

Assistant:

void HighsMipSolverData::checkObjIntegrality() {
  objectiveFunction.checkIntegrality(epsilon);
  if (objectiveFunction.isIntegral() && numRestarts == 0) {
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "Objective function is integral with scale %g\n",
                 objectiveFunction.integralScale());
  }
}